

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O1

int __thiscall QuadraticFunctor::df(QuadraticFunctor *this,VectorXd *x,MatrixXd *fjac)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  Index IVar9;
  Index index;
  double *pdVar10;
  ulong uVar11;
  undefined8 *puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  Index inner;
  ulong uVar16;
  long lVar17;
  Index size;
  undefined1 auVar18 [16];
  VectorXd fvecMinus;
  VectorXd fvecPlus;
  VectorXd xPlus;
  VectorXd xMinus;
  VectorXd local_98;
  VectorXd local_88;
  DenseStorage<double,__1,__1,_1,_0> local_70;
  DenseStorage<double,__1,__1,_1,_0> *local_60;
  DenseStorage<double,__1,__1,_1,_0> local_58;
  QuadraticFunctor *local_48;
  MatrixXd *local_40;
  long local_38;
  
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_70,(DenseStorage<double,__1,__1,_1,_0> *)x);
  if (0 < local_70.m_rows) {
    lVar17 = 0;
    lVar15 = 0;
    local_60 = (DenseStorage<double,__1,__1,_1,_0> *)x;
    local_48 = this;
    local_40 = fjac;
    do {
      local_70.m_data[lVar15] = local_70.m_data[lVar15] + 9.999999747378752e-06;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_58,(DenseStorage<double,__1,__1,_1,_0> *)x);
      if (local_58.m_rows <= lVar15) break;
      local_58.m_data[lVar15] = local_58.m_data[lVar15] + -9.999999747378752e-06;
      iVar4 = this->m;
      uVar14 = (ulong)iVar4;
      local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      local_38 = lVar15;
      if ((long)uVar14 < 0) {
LAB_001136e2:
        __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      pdVar10 = local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
      if (uVar14 != 0) {
        free((void *)0x0);
        if (iVar4 == 0) {
          local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (double *)0x0;
          pdVar10 = local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
        }
        else {
          pdVar10 = (double *)malloc(uVar14 * 8);
          if (iVar4 != 1 && ((ulong)pdVar10 & 0xf) != 0) goto LAB_00113701;
          if (pdVar10 == (double *)0x0) {
            puVar12 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar12 = std::ostream::_M_insert<long>;
            __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
        }
      }
      local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar10;
      local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           uVar14;
      operator()(this,(VectorXd *)&local_70,&local_88);
      iVar4 = this->m;
      uVar14 = (ulong)iVar4;
      local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      if ((long)uVar14 < 0) goto LAB_001136e2;
      pdVar10 = local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
      if (uVar14 != 0) {
        free((void *)0x0);
        if (iVar4 == 0) {
          local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (double *)0x0;
          pdVar10 = local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
        }
        else {
          pdVar10 = (double *)malloc(uVar14 * 8);
          if (iVar4 != 1 && ((ulong)pdVar10 & 0xf) != 0) goto LAB_00113701;
          if (pdVar10 == (double *)0x0) {
            puVar12 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar12 = std::ostream::_M_insert<long>;
            __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
        }
      }
      local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar10;
      local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           uVar14;
      operator()(this,(VectorXd *)&local_58,&local_98);
      iVar4 = this->m;
      uVar14 = (ulong)iVar4;
      if ((long)uVar14 < 0) goto LAB_001136e2;
      if (iVar4 == 0) {
        pdVar10 = (double *)0x0;
      }
      else {
        pdVar10 = (double *)malloc(uVar14 * 8);
        if (iVar4 != 1 && ((ulong)pdVar10 & 0xf) != 0) goto LAB_00113701;
        if (pdVar10 == (double *)0x0) {
          puVar12 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar12 = std::ostream::_M_insert<long>;
          __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      pdVar3 = local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      IVar9 = local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      pdVar5 = local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      if (local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows) {
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
          0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != uVar14) {
        free(pdVar10);
        uVar14 = IVar9;
        if (IVar9 == 0) {
          pdVar10 = (double *)0x0;
        }
        else {
          if (0x1fffffffffffffff < (ulong)IVar9) {
LAB_00113808:
            puVar12 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar12 = std::ostream::_M_insert<long>;
            __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pdVar10 = (double *)malloc(IVar9 * 8);
          if (IVar9 != 1 && ((ulong)pdVar10 & 0xf) != 0) {
LAB_00113701:
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                          "void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (pdVar10 == (double *)0x0) goto LAB_00113808;
        }
      }
      lVar15 = local_38;
      this = local_48;
      x = (VectorXd *)local_60;
      auVar8 = _DAT_00118130;
      if (uVar14 != IVar9) {
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
                     );
      }
      uVar11 = uVar14 & 0x1ffffffffffffffe;
      if (1 < (long)uVar14) {
        uVar13 = 0;
        do {
          pdVar1 = pdVar3 + uVar13;
          pdVar2 = pdVar5 + uVar13;
          auVar18._0_8_ = *pdVar1 - *pdVar2;
          auVar18._8_8_ = pdVar1[1] - pdVar2[1];
          auVar18 = divpd(auVar18,auVar8);
          *(undefined1 (*) [16])(pdVar10 + uVar13) = auVar18;
          uVar13 = uVar13 + 2;
        } while (uVar13 < uVar11);
      }
      if ((long)uVar11 < (long)uVar14) {
        do {
          pdVar10[uVar11] = (pdVar3[uVar11] - pdVar5[uVar11]) / 1.9999999494757503e-05;
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
      iVar4 = local_48->m;
      uVar11 = (ulong)iVar4;
      pdVar5 = (local_40->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      if (pdVar5 != (double *)0x0 && (long)uVar11 < 0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, Level = 0]"
                     );
      }
      if (((iVar4 < 0) ||
          (lVar6 = (local_40->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows, lVar6 < (long)uVar11)) ||
         ((local_40->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols <= local_38)) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      if (uVar14 != uVar11) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
                     );
      }
      pdVar3 = pdVar5 + lVar6 * local_38;
      if (((ulong)pdVar3 & 7) == 0) {
        uVar14 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1);
        if ((long)uVar11 <= (long)uVar14) {
          uVar14 = uVar11;
        }
        if (0 < (long)uVar14) {
          *pdVar3 = *pdVar10;
        }
        uVar16 = uVar11 - uVar14 & 0xfffffffffffffffe;
        uVar13 = uVar16 | uVar14;
        if (0 < (long)uVar16) {
          do {
            dVar7 = (pdVar10 + uVar14)[1];
            pdVar3 = (double *)((long)pdVar5 + uVar14 * 8 + lVar6 * lVar17);
            *pdVar3 = pdVar10[uVar14];
            pdVar3[1] = dVar7;
            uVar14 = uVar14 + 2;
          } while ((long)uVar14 < (long)uVar13);
        }
        if ((long)uVar13 < (long)uVar11) {
          do {
            *(double *)((long)pdVar5 + uVar13 * 8 + lVar6 * lVar17) = pdVar10[uVar13];
            uVar13 = uVar13 + 1;
          } while ((long)uVar13 < (long)uVar11);
        }
      }
      else if (iVar4 != 0) {
        uVar14 = 0;
        do {
          *(double *)((long)pdVar5 + uVar14 * 8 + lVar6 * lVar17) = pdVar10[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
      }
      free(pdVar10);
      free(local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      free(local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      free(local_58.m_data);
      free(local_70.m_data);
      lVar15 = lVar15 + 1;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_70,(DenseStorage<double,__1,__1,_1,_0> *)x);
      lVar17 = lVar17 + 8;
    } while (lVar15 < local_70.m_rows);
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

int df(const Eigen::VectorXd &x, Eigen::MatrixXd &fjac) const
    {
        // 'x' has dimensions n x 1
        // It contains the current estimates for the parameters.

        // 'fjac' has dimensions m x n
        // It will contain the jacobian of the errors, calculated numerically in this case.

        float epsilon;
        epsilon = 1e-5f;

        for (int i = 0; i < x.size(); i++)
        {
            Eigen::VectorXd xPlus(x);
            xPlus(i) += epsilon;
            Eigen::VectorXd xMinus(x);
            xMinus(i) -= epsilon;

            Eigen::VectorXd fvecPlus(values());
            operator()(xPlus, fvecPlus);

            Eigen::VectorXd fvecMinus(values());
            operator()(xMinus, fvecMinus);

            Eigen::VectorXd fvecDiff(values());
            fvecDiff = (fvecPlus - fvecMinus) / (2.0f * epsilon);

            fjac.block(0, i, values(), 1) = fvecDiff;
        }
    }